

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webvttparser.cc
# Opt level: O3

int __thiscall libwebvtt::LineReader::GetLine(LineReader *this,string *line_ptr)

{
  int iVar1;
  undefined8 in_RAX;
  char c_1;
  char c;
  undefined8 uStack_28;
  
  if (line_ptr == (string *)0x0) {
    iVar1 = -1;
  }
  else {
    line_ptr->_M_string_length = 0;
    *(line_ptr->_M_dataplus)._M_p = '\0';
    uStack_28 = in_RAX;
    iVar1 = (**(this->super_Reader)._vptr_Reader)(this,(long)&uStack_28 + 6);
    if (-1 < iVar1) {
      while( true ) {
        if (iVar1 != 0) {
          return (uint)(line_ptr->_M_string_length == 0);
        }
        if (uStack_28._6_1_ == 10) break;
        if (uStack_28._6_1_ == 0xd) {
          iVar1 = (**(this->super_Reader)._vptr_Reader)(this,(long)&uStack_28 + 7);
          if (iVar1 < 0) {
            return iVar1;
          }
          if (iVar1 != 0) {
            return 0;
          }
          if (uStack_28._7_1_ == '\n') {
            return 0;
          }
          (*(this->super_Reader)._vptr_Reader[3])(this,(ulong)(uint)(int)uStack_28._7_1_);
          return 0;
        }
        if (0xfd < uStack_28._6_1_) {
          return -1;
        }
        if (9999 < line_ptr->_M_string_length) {
          return -1;
        }
        std::__cxx11::string::push_back((char)line_ptr);
        iVar1 = (**(this->super_Reader)._vptr_Reader)(this,(long)&uStack_28 + 6);
        if (iVar1 < 0) {
          return iVar1;
        }
      }
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int LineReader::GetLine(std::string* line_ptr) {
  if (line_ptr == NULL)
    return -1;

  std::string& ln = *line_ptr;
  ln.clear();

  // Consume characters from the stream, until we
  // reach end-of-line (or end-of-stream).

  // The WebVTT spec states that lines may be
  // terminated in any of these three ways:
  //  LF
  //  CR
  //  CR LF

  // We interrogate each character as we read it from the stream.
  // If we detect an end-of-line character, we consume the full
  // end-of-line indication, and we're done; otherwise, accumulate
  // the character and repeat.

  for (;;) {
    char c;
    const int e = GetChar(&c);

    if (e < 0)  // error
      return e;

    if (e > 0)  // EOF
      return (ln.empty()) ? 1 : 0;

    // We have a character, so we must first determine
    // whether we have reached end-of-line.

    if (c == kLF)
      return 0;  // handle the easy end-of-line case immediately

    if (c == kCR)
      break;  // handle the hard end-of-line case outside of loop

    if (c == '\xFE' || c == '\xFF')  // not UTF-8
      return -1;

    // To defend against pathological or malicious streams, we
    // cap the line length at some arbitrarily-large value:
    enum { kMaxLineLength = 10000 };  // arbitrary

    if (ln.length() >= kMaxLineLength)
      return -1;

    // We don't have an end-of-line character, so accumulate
    // the character in our line buffer.
    ln.push_back(c);
  }

  // We detected a CR.  We must interrogate the next character
  // in the stream, to determine whether we have a LF (which
  // would make it part of this same line).

  char c;
  const int e = GetChar(&c);

  if (e < 0)  // error
    return e;

  if (e > 0)  // EOF
    return 0;

  // If next character in the stream is not a LF, return it
  // to the stream (because it's part of the next line).
  if (c != kLF)
    UngetChar(c);

  return 0;
}